

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O1

TA_RetCode
CallTestFunction(RangeTestFunction testFunction,TA_Integer startIdx,TA_Integer endIdx,
                TA_Real *outputBuffer,TA_Integer *outputBufferInt,TA_Integer *outBegIdx,
                TA_Integer *outNbElement,TA_Integer *lookback,void *opaqueData,uint outputNb,
                uint *isOutputInteger)

{
  double dVar1;
  TA_RetCode TVar2;
  clock_t cVar3;
  clock_t cVar4;
  
  cVar3 = clock();
  TVar2 = (*testFunction)(startIdx,endIdx,outputBuffer,outputBufferInt,outBegIdx,outNbElement,
                          lookback,opaqueData,outputNb,isOutputInteger);
  if (0x13 < *outNbElement) {
    cVar4 = clock();
    if (cVar4 - cVar3 < 1) {
      insufficientClockPrecision = 1;
    }
    else {
      dVar1 = (double)(cVar4 - cVar3);
      if (worstProfiledCall < dVar1) {
        worstProfiledCall = dVar1;
      }
      timeInProfiledCall = dVar1 + timeInProfiledCall;
      nbProfiledCall = nbProfiledCall + 1;
    }
  }
  return TVar2;
}

Assistant:

static TA_RetCode CallTestFunction( RangeTestFunction testFunction,
                                    TA_Integer    startIdx,
                                    TA_Integer    endIdx,
                                    TA_Real      *outputBuffer,
                                    TA_Integer   *outputBufferInt,
                                    TA_Integer   *outBegIdx,
                                    TA_Integer   *outNbElement,
                                    TA_Integer   *lookback,
                                    void         *opaqueData,
                                    unsigned int  outputNb,
                                    unsigned int *isOutputInteger )
{
   /* Call the function and do profiling. */
   TA_RetCode retCode;
   double clockDelta;

#ifdef WIN32
   LARGE_INTEGER startClock;
   LARGE_INTEGER endClock;
#else
   clock_t startClock;
   clock_t endClock;
#endif

#ifdef WIN32
   QueryPerformanceCounter(&startClock);
#else
   startClock = clock();
#endif
	retCode = testFunction( startIdx,
                  endIdx,
                  outputBuffer,
                  outputBufferInt,
                  outBegIdx,
                  outNbElement,
                  lookback,
                  opaqueData,
                  outputNb,
                  isOutputInteger );

	/* Profile only functions producing at least 20 values. */
	if( *outNbElement < 20 )
	{
		return retCode;
	}

#ifdef WIN32
   QueryPerformanceCounter(&endClock);
   clockDelta = (double)((__int64)endClock.QuadPart - (__int64) startClock.QuadPart);
#else
   endClock = clock();
   clockDelta = (double)(endClock - startClock);
#endif

   if( clockDelta <= 0 )
   {
	   insufficientClockPrecision = 1;
   }
   else
   {
      if( clockDelta > worstProfiledCall )
         worstProfiledCall = clockDelta;
      timeInProfiledCall += clockDelta;
      nbProfiledCall++;
   }

   return retCode;
}